

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

CappedArray<char,_24UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_24UL> *__return_storage_ptr__,Stringifier *this,float f)

{
  char *pcVar1;
  size_t s;
  CappedArray<char,_24UL> *result;
  float f_local;
  Stringifier *this_local;
  
  CappedArray<char,_24UL>::CappedArray(__return_storage_ptr__);
  pcVar1 = CappedArray<char,_24UL>::begin(__return_storage_ptr__);
  pcVar1 = anon_unknown_1::FloatToBuffer(f,pcVar1);
  s = strlen(pcVar1);
  CappedArray<char,_24UL>::setSize(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

CappedArray<char, kFloatToBufferSize> Stringifier::operator*(float f) const {
  CappedArray<char, kFloatToBufferSize> result;
  result.setSize(strlen(FloatToBuffer(f, result.begin())));
  return result;
}